

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O1

bool __thiscall SectionHdrWrapper::reloadName(SectionHdrWrapper *this)

{
  long *plVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar7;
  storage_type *psVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_50;
  char16_t *local_48;
  qsizetype local_40;
  QArrayData *local_38 [3];
  long *plVar6;
  
  iVar5 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar6 == (long *)0x0) goto LAB_0012d86f;
  plVar1 = (long *)this->name;
  if (plVar1 == (long *)0x0) {
LAB_0012d7c0:
    pcVar7 = (char *)calloc(10,1);
    this->name = pcVar7;
  }
  else {
    if (*plVar1 == *plVar6) goto LAB_0012d86f;
    if (plVar1 == (long *)0x0) goto LAB_0012d7c0;
  }
  pcVar7 = this->name;
  pcVar7[8] = '\0';
  pcVar7[9] = '\0';
  pcVar7[0] = '\0';
  pcVar7[1] = '\0';
  pcVar7[2] = '\0';
  pcVar7[3] = '\0';
  pcVar7[4] = '\0';
  pcVar7[5] = '\0';
  pcVar7[6] = '\0';
  pcVar7[7] = '\0';
  *(long *)this->name = *plVar6;
  if (this->name == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar8 = (storage_type *)strlen(this->name);
  }
  QVar9.m_data = psVar8;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  pQVar2 = &((this->mappedName).d.d)->super_QArrayData;
  (this->mappedName).d.d = (Data *)local_50;
  pcVar3 = (this->mappedName).d.ptr;
  (this->mappedName).d.ptr = local_48;
  qVar4 = (this->mappedName).d.size;
  (this->mappedName).d.size = local_40;
  local_50 = pQVar2;
  local_48 = pcVar3;
  local_40 = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,8);
    }
  }
  if ((this->mappedName).d.size == 0) {
    QString::number((ulong)local_38,(int)this->sectNum);
    QVar10.m_data = (storage_type *)0x1;
    QVar10.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar10);
    QString::append((QString *)&local_50);
    QString::operator=(&this->mappedName,(QString *)&local_50);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,8);
      }
    }
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,8);
      }
    }
  }
LAB_0012d86f:
  return plVar6 != (long *)0x0;
}

Assistant:

bool SectionHdrWrapper::reloadName()
{
    IMAGE_SECTION_HEADER* header = (IMAGE_SECTION_HEADER*) getPtr();
    if (!header) return false;

    if (this->name) {
        if (memcmp(this->name, header->Name, SECNAME_LEN) == 0) {
            return true; //no need to reload
        }
    }
    const size_t BUF_LEN = SECNAME_LEN + 2;
    if (!this->name) {
        this->name = (char*)::calloc(BUF_LEN, 1);
    }
    ::memset(this->name, 0, BUF_LEN);
    ::memcpy(this->name, header->Name, SECNAME_LEN);
    this->mappedName = this->name;
    if (this->mappedName.length() == 0) {
        this->mappedName = "#" + QString::number(this->sectNum, 10);
    }
    return true;
}